

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O3

bool __thiscall
crnlib::crn_comp::update_progress
          (crn_comp *this,uint phase_index,uint subphase_index,uint subphase_total)

{
  crn_progress_callback_func p_Var1;
  crn_bool cVar2;
  
  p_Var1 = this->m_pParams->m_pProgress_func;
  if (p_Var1 != (crn_progress_callback_func)0x0) {
    cVar2 = (*p_Var1)(phase_index,0x19,subphase_index,subphase_total,
                      this->m_pParams->m_pProgress_func_data);
    return cVar2 != 0;
  }
  return true;
}

Assistant:

bool crn_comp::update_progress(uint phase_index, uint subphase_index, uint subphase_total) {
  if (!m_pParams->m_pProgress_func)
    return true;

#if CRNLIB_ENABLE_DEBUG_MESSAGES
  if (m_pParams->m_flags & cCRNCompFlagDebugging)
    return true;
#endif

  return (*m_pParams->m_pProgress_func)(phase_index, cTotalCompressionPhases, subphase_index, subphase_total, m_pParams->m_pProgress_func_data) != 0;
}